

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

bool upb::generator::ParseOptions(MiniTableOptions *options,Plugin *plugin)

{
  bool bVar1;
  char *in_RCX;
  MiniTableOptions *pMVar2;
  pointer __lhs;
  Arg *in_R8;
  string_view sVar3;
  string_view text;
  string_view error;
  string local_98;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  size_type local_60;
  pointer local_58;
  
  sVar3 = Plugin::parameter(plugin);
  text._M_len = sVar3._M_str;
  text._M_str = in_RCX;
  ParseGeneratorParameter_abi_cxx11_(&local_78,(generator *)sVar3._M_len,text);
  __lhs = local_78.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__lhs == local_78.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00113b2d:
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_78);
      return __lhs == local_78.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    }
    bVar1 = std::operator==(&__lhs->first,"bootstrap_stage");
    pMVar2 = options;
    if (!bVar1) {
      bVar1 = std::operator==(&__lhs->first,"experimental_strip_nonfunctional_codegen");
      pMVar2 = (MiniTableOptions *)&options->strip_nonfunctional_codegen;
      if (!bVar1) {
        bVar1 = std::operator==(&__lhs->first,"one_output_per_message");
        pMVar2 = (MiniTableOptions *)&options->one_output_per_message;
        if (!bVar1) {
          local_58 = (__lhs->first)._M_dataplus._M_p;
          local_60 = (__lhs->first)._M_string_length;
          sVar3._M_str = (char *)&local_60;
          sVar3._M_len = (size_t)"Unknown parameter: $0";
          absl::lts_20240722::Substitute_abi_cxx11_(&local_98,(lts_20240722 *)0x15,sVar3,in_R8);
          error._M_str = local_98._M_dataplus._M_p;
          error._M_len = local_98._M_string_length;
          Plugin::SetError(plugin,error);
          std::__cxx11::string::~string((string *)&local_98);
          goto LAB_00113b2d;
        }
      }
    }
    pMVar2->bootstrap = true;
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

bool ParseOptions(MiniTableOptions* options, Plugin* plugin) {
  for (const auto& pair : ParseGeneratorParameter(plugin->parameter())) {
    if (pair.first == "bootstrap_stage") {
      options->bootstrap = true;
    } else if (pair.first == "experimental_strip_nonfunctional_codegen") {
      options->strip_nonfunctional_codegen = true;
    } else if (pair.first == "one_output_per_message") {
      options->one_output_per_message = true;
    } else {
      plugin->SetError(absl::Substitute("Unknown parameter: $0", pair.first));
      return false;
    }
  }

  return true;
}